

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O3

char * __thiscall google::protobuf::Field::_InternalParse(Field *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  ArenaStringPtr *this_04;
  byte bVar1;
  int iVar2;
  bool bVar3;
  Option *msg;
  ulong uVar4;
  Rep *pRVar5;
  ArenaStringPtr *field_name;
  int iVar6;
  char *pcVar7;
  Arena *pAVar8;
  UnknownFieldSet *unknown;
  byte *p;
  internal *this_05;
  char cVar9;
  uint uVar10;
  string *psVar11;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  StringPiece str;
  byte *local_38;
  char *size;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->default_value_;
  this_02 = &this->json_name_;
  this_03 = &this->type_url_;
  this_04 = &this->name_;
  local_38 = (byte *)ptr;
  do {
    bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    uVar10 = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      uVar10 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar12 = internal::ReadTagFallback((char *)local_38,uVar10);
        p = (byte *)pVar12.first;
        if (p == (byte *)0x0) {
          return (char *)0x0;
        }
        uVar10 = pVar12.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    cVar9 = (char)uVar10;
    local_38 = p;
    switch(uVar10 >> 3) {
    case 1:
      if (cVar9 != '\b') break;
      uVar4 = (ulong)(char)*p;
      local_38 = p + 1;
      if ((long)uVar4 < 0) {
        uVar10 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
        if (-1 < (char)*local_38) {
          uVar4 = (ulong)uVar10;
          local_38 = p + 2;
          goto LAB_0020cdfb;
        }
        local_38 = p;
        pVar13 = internal::VarintParseSlow64((char *)p,uVar10);
        iVar6 = (int)pVar13.second;
        local_38 = (byte *)pVar13.first;
        if (local_38 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      else {
LAB_0020cdfb:
        iVar6 = (int)uVar4;
      }
      this->kind_ = iVar6;
LAB_0020cf26:
      cVar9 = '\x02';
      goto LAB_0020d263;
    case 2:
      if (cVar9 == '\x10') {
        uVar4 = (ulong)(char)*p;
        local_38 = p + 1;
        if ((long)uVar4 < 0) {
          uVar10 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
          if (-1 < (char)*local_38) {
            uVar4 = (ulong)uVar10;
            local_38 = p + 2;
            goto LAB_0020ced8;
          }
          local_38 = p;
          pVar13 = internal::VarintParseSlow64((char *)p,uVar10);
          iVar6 = (int)pVar13.second;
          local_38 = (byte *)pVar13.first;
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        }
        else {
LAB_0020ced8:
          iVar6 = (int)uVar4;
        }
        this->cardinality_ = iVar6;
        goto LAB_0020cf26;
      }
      break;
    case 3:
      if (cVar9 != '\x18') break;
      bVar1 = *p;
      uVar10 = (uint)bVar1;
      local_38 = p + 1;
      if (-1 < (char)bVar1) {
LAB_0020ce54:
        this->number_ = uVar10;
        goto LAB_0020cf26;
      }
      uVar10 = ((uint)bVar1 + (uint)*local_38 * 0x80) - 0x80;
      if (-1 < (char)*local_38) {
        local_38 = p + 2;
        goto LAB_0020ce54;
      }
      local_38 = p;
      pVar13 = internal::VarintParseSlow64((char *)p,uVar10);
      local_38 = (byte *)pVar13.first;
      this->number_ = (int32)pVar13.second;
      goto LAB_0020d257;
    case 4:
      if (cVar9 == '\"') {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        psVar11 = this_04->ptr_;
        field_name = this_04;
        if (psVar11 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_04,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar11 = this_04->ptr_;
        }
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar11,(char *)local_38,ctx);
        this_05 = (internal *)(psVar11->_M_dataplus)._M_p;
        size = (char *)psVar11->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar7 = "google.protobuf.Field.name";
LAB_0020d1ee:
        str.length_ = (stringpiece_ssize_type)pcVar7;
        str.ptr_ = size;
        bVar3 = internal::VerifyUTF8(this_05,str,(char *)field_name);
        if (!bVar3) {
          return (char *)0x0;
        }
        cVar9 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
        goto LAB_0020d263;
      }
      break;
    case 6:
      if (cVar9 == '2') {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        psVar11 = this_03->ptr_;
        field_name = this_03;
        if (psVar11 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_03,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar11 = this_03->ptr_;
        }
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar11,(char *)local_38,ctx);
        this_05 = (internal *)(psVar11->_M_dataplus)._M_p;
        size = (char *)psVar11->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar7 = "google.protobuf.Field.type_url";
        goto LAB_0020d1ee;
      }
      break;
    case 7:
      if (cVar9 == '8') {
        bVar1 = *p;
        uVar10 = (uint)bVar1;
        local_38 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar10 = ((uint)bVar1 + (uint)*local_38 * 0x80) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar13 = internal::VarintParseSlow64((char *)p,uVar10);
            local_38 = (byte *)pVar13.first;
            this->oneof_index_ = (int32)pVar13.second;
            goto LAB_0020d257;
          }
          local_38 = p + 2;
        }
        this->oneof_index_ = uVar10;
        goto LAB_0020cf26;
      }
      break;
    case 8:
      if (cVar9 == '@') {
        uVar4 = (ulong)(char)*p;
        local_38 = p + 1;
        if ((long)uVar4 < 0) {
          uVar10 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar13 = internal::VarintParseSlow64((char *)p,uVar10);
            local_38 = (byte *)pVar13.first;
            this->packed_ = pVar13.second != 0;
            goto LAB_0020d257;
          }
          uVar4 = (ulong)uVar10;
          local_38 = p + 2;
        }
        this->packed_ = uVar4 != 0;
        goto LAB_0020cf26;
      }
      break;
    case 9:
      if (cVar9 == 'J') {
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar5 = (this->options_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar5 == (Rep *)0x0) {
            iVar6 = (this->options_).super_RepeatedPtrFieldBase.total_size_;
LAB_0020cf4f:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->options_).super_RepeatedPtrFieldBase,iVar6 + 1);
            pRVar5 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            iVar6 = pRVar5->allocated_size;
LAB_0020cf60:
            pRVar5->allocated_size = iVar6 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::Option>
                            ((this->options_).super_RepeatedPtrFieldBase.arena_);
            pRVar5 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            iVar6 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
            pRVar5->elements[iVar6] = msg;
          }
          else {
            iVar2 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            iVar6 = pRVar5->allocated_size;
            if (iVar6 <= iVar2) {
              if (iVar6 == (this->options_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0020cf4f;
              goto LAB_0020cf60;
            }
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (Option *)pRVar5->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Option>
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x4a));
        goto LAB_0020cf26;
      }
      break;
    case 10:
      if (cVar9 == 'R') {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        psVar11 = this_02->ptr_;
        field_name = this_02;
        if (psVar11 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_02,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar11 = this_02->ptr_;
        }
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar11,(char *)local_38,ctx);
        this_05 = (internal *)(psVar11->_M_dataplus)._M_p;
        size = (char *)psVar11->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar7 = "google.protobuf.Field.json_name";
        goto LAB_0020d1ee;
      }
      break;
    case 0xb:
      if (cVar9 == 'Z') {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        psVar11 = this_01->ptr_;
        field_name = this_01;
        if (psVar11 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_01,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar11 = this_01->ptr_;
        }
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar11,(char *)local_38,ctx);
        this_05 = (internal *)(psVar11->_M_dataplus)._M_p;
        size = (char *)psVar11->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar7 = "google.protobuf.Field.default_value";
        goto LAB_0020d1ee;
      }
    }
    if ((uVar10 == 0) || ((uVar10 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
      return (char *)p;
    }
    if (((ulong)this_00->ptr_ & 1) == 0) {
      unknown = internal::InternalMetadata::
                mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    local_38 = (byte *)internal::UnknownFieldParse((ulong)uVar10,unknown,(char *)local_38,ctx);
LAB_0020d257:
    cVar9 = '\x02';
    if (local_38 == (byte *)0x0) {
      return (char *)0x0;
    }
LAB_0020d263:
    if (cVar9 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Field::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // .google.protobuf.Field.Kind kind = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_kind(static_cast<PROTOBUF_NAMESPACE_ID::Field_Kind>(val));
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Field.Cardinality cardinality = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_cardinality(static_cast<PROTOBUF_NAMESPACE_ID::Field_Cardinality>(val));
        } else goto handle_unusual;
        continue;
      // int32 number = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string name = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string type_url = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          auto str = _internal_mutable_type_url();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.type_url"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // int32 oneof_index = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          oneof_index_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // bool packed = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 64)) {
          packed_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Option options = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_options(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // string json_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          auto str = _internal_mutable_json_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.json_name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // string default_value = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90)) {
          auto str = _internal_mutable_default_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Field.default_value"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}